

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O0

bool DecodeHexBlk(CBlock *block,string *strHexBlk)

{
  string_view str;
  Span<const_unsigned_char> sp;
  string_view hex_str;
  bool bVar1;
  char *in_RSI;
  long in_FS_OFFSET;
  __sv_type _Var2;
  exception *anon_var_0;
  DataStream ssBlock;
  vector<unsigned_char,_std::allocator<unsigned_char>_> blockData;
  DataStream *in_stack_ffffffffffffff18;
  CBlock *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  undefined1 *puVar3;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  char *pcVar4;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff38);
  pcVar4 = _Var2._M_str;
  str._M_str._0_4_ = in_stack_ffffffffffffff48;
  str._M_len = in_stack_ffffffffffffff40;
  str._M_str._4_4_ = in_stack_ffffffffffffff4c;
  bVar1 = IsHex(str);
  if (bVar1) {
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff38);
    puVar3 = local_20;
    hex_str._M_str = in_RSI;
    hex_str._M_len = (size_t)pcVar4;
    ParseHex<unsigned_char>(hex_str);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18);
    sp.m_size._0_4_ = in_stack_ffffffffffffff48;
    sp.m_data = puVar3;
    sp.m_size._4_4_ = in_stack_ffffffffffffff4c;
    DataStream::DataStream
              ((DataStream *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),sp);
    TransactionSerParams::operator()
              ((TransactionSerParams *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28)
               ,in_stack_ffffffffffffff20);
    DataStream::operator>>
              ((DataStream *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
               (ParamsWrapper<TransactionSerParams,_CBlock> *)in_stack_ffffffffffffff20);
    DataStream::~DataStream(in_stack_ffffffffffffff18);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool DecodeHexBlk(CBlock& block, const std::string& strHexBlk)
{
    if (!IsHex(strHexBlk))
        return false;

    std::vector<unsigned char> blockData(ParseHex(strHexBlk));
    DataStream ssBlock(blockData);
    try {
        ssBlock >> TX_WITH_WITNESS(block);
    }
    catch (const std::exception&) {
        return false;
    }

    return true;
}